

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O3

void parse_tok(char **p,char **tok,size_t *tok_len)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = *p;
  iVar1 = isspace((int)*pcVar4);
  while (iVar1 != 0) {
    pcVar4 = pcVar4 + 1;
    *p = pcVar4;
    iVar1 = isspace((int)*pcVar4);
  }
  *tok = pcVar4;
  pcVar3 = *p;
  cVar2 = *pcVar3;
  if (cVar2 != '\0') {
    pcVar4 = pcVar3 + 1;
    while (iVar1 = isspace((int)cVar2), iVar1 == 0) {
      if ((cVar2 == '\n') || (cVar2 == '\r')) goto LAB_0020878f;
      pcVar3 = pcVar3 + 1;
      *p = pcVar4;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
      if (cVar2 == '\0') break;
    }
    pcVar3 = pcVar4 + -1;
LAB_0020878f:
    pcVar4 = *tok;
  }
  *tok_len = (long)pcVar3 - (long)pcVar4;
  return;
}

Assistant:

static void parse_tok(char *&p, char *&tok, size_t &tok_len)
{
    /* skip leading spaces */
    for ( ; isspace(*p) ; ++p) ;

    /* the token starts here */
    tok = p;

    /* 
     *   find the end of the token - it's the end of the string, or the next
     *   whitespace or newline (CR or LF) character 
     */
    for ( ; *p != '\0' && !isspace(*p) && *p != '\n' && *p != '\r' ; ++p) ;

    /* note the length of the token */
    tok_len = p - tok;
}